

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

call_matcher_base<void_()> *
trompeloeil::find<void()>(call_matcher_list<void_()> *list,call_params_type_t<void_()> *p)

{
  int iVar1;
  uint uVar2;
  call_matcher_base<void_()> *pcVar3;
  uint uVar4;
  call_matcher_base<void_()> *pcVar5;
  
  pcVar5 = (call_matcher_base<void_()> *)
           (list->super_list<trompeloeil::call_matcher_base<void_()>,_trompeloeil::ignore_disposer>)
           .super_list_elem<trompeloeil::call_matcher_base<void_()>_>.next;
  if (pcVar5 == (call_matcher_base<void_()> *)list) {
    pcVar3 = (call_matcher_base<void_()> *)0x0;
  }
  else {
    uVar4 = 0xffffffff;
    pcVar3 = (call_matcher_base<void_()> *)0x0;
    do {
      iVar1 = (*(pcVar5->super_list_elem<trompeloeil::call_matcher_base<void_()>_>)._vptr_list_elem
                [3])(pcVar5,p);
      if ((char)iVar1 != '\0') {
        uVar2 = (*(pcVar5->super_list_elem<trompeloeil::call_matcher_base<void_()>_>).
                  _vptr_list_elem[4])(pcVar5);
        if (uVar2 == 0) {
          return pcVar5;
        }
        if (uVar2 < uVar4 || pcVar3 == (call_matcher_base<void_()> *)0x0) {
          pcVar3 = pcVar5;
          uVar4 = uVar2;
        }
      }
      pcVar5 = (call_matcher_base<void_()> *)
               (pcVar5->super_list_elem<trompeloeil::call_matcher_base<void_()>_>).next;
    } while (pcVar5 != (call_matcher_base<void_()> *)list);
  }
  return pcVar3;
}

Assistant:

call_matcher_base <Sig> *
  find(
    call_matcher_list <Sig> &list,
    call_params_type_t <Sig> const &p)
  noexcept
  {
    call_matcher_base<Sig>* first_match = nullptr;
    unsigned lowest_cost = ~0U;
    for (auto& i : list)
    {
      if (i.matches(p))
      {
        unsigned cost = i.sequence_cost();
        if (cost == 0)
        {
          return &i;
        }
        if (!first_match || cost < lowest_cost)
        {
          first_match = &i;
          lowest_cost = cost;
        }
      }
    }
    return first_match;
  }